

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O2

uint8_t * readAsn1Int(uint8_t *input,uint8_t *end,uint8_t *output)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  ulong __n;
  
  if ((input != end) && (*input == '\x02')) {
    puVar3 = input + 1;
    if (puVar3 == end) {
      bVar1 = 0;
    }
    else {
      bVar1 = input[1];
      puVar3 = input + 2;
    }
    if (puVar3 + bVar1 <= end && bVar1 != 0) {
      bVar2 = 0x20;
      if (bVar1 != 0x21) {
        bVar2 = bVar1;
      }
      __n = (ulong)bVar2;
      memcpy(output + (0x20 - __n),puVar3 + (bVar1 == 0x21),__n);
      return puVar3 + (bVar1 == 0x21) + __n;
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

static const uint8_t*
readAsn1Int(const uint8_t* input, const uint8_t* end, uint8_t* output)
{
  if (input == end || *(input++) != ASN1_INTEGER)
    return NULL;

  uint8_t length = (input == end) ? 0 : *(input++);
  if (length == 0 || input + length > end)
    return NULL;

  if (length == 33) {
    --length;
    ++input;
  }
  memcpy(output + 32 - length, input, length);
  return input + length;
}